

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O0

ostream * google::protobuf::operator<<(ostream *o,uint128 *b)

{
  uint128 divisor;
  uint128 divisor_00;
  uint128 dividend;
  uint128 dividend_00;
  char cVar1;
  _Ios_Fmtflags _Var2;
  undefined8 uVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 *in_RSI;
  ostream *in_RDI;
  streamsize width;
  string rep;
  uint128 mid;
  uint128 low;
  uint128 high;
  fmtflags copy_mask;
  ostringstream os;
  streamsize div_base_log;
  uint128 div;
  fmtflags flags;
  undefined8 in_stack_fffffffffffffcc8;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  string local_2a0 [36];
  int local_27c;
  char local_275;
  int local_274;
  int local_270;
  char local_269;
  uint64 local_268;
  uint64 uStack_260;
  uint128 *in_stack_fffffffffffffda8;
  uint128 *in_stack_fffffffffffffdb0;
  ulong in_stack_fffffffffffffdb8;
  uint64 in_stack_fffffffffffffdc0;
  uint64 uVar7;
  uint64 uVar8;
  uint128 local_218;
  uint128 *local_208;
  uint128 *puStack_200;
  _Ios_Fmtflags local_1dc;
  ostringstream local_1d8 [376];
  uint128 local_60;
  uint128 local_50;
  uint128 local_40;
  undefined8 local_30;
  uint128 local_28;
  _Ios_Fmtflags local_14;
  undefined8 *local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_14 = std::ios_base::flags((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  uint128::uint128(&local_28);
  _Var2 = std::operator&(local_14,_S_basefield);
  if (_Var2 == _S_hex) {
    uint128::uint128(&local_40,0x1000000000000000);
    local_28.lo_ = local_40.lo_;
    local_28.hi_ = local_40.hi_;
    local_30 = 0xf;
  }
  else if (_Var2 == _S_oct) {
    uint128::uint128(&local_50,0x8000000000000000);
    local_28.lo_ = local_50.lo_;
    local_28.hi_ = local_50.hi_;
    local_30 = 0x15;
  }
  else {
    uint128::uint128(&local_60,10000000000000000000);
    local_28.lo_ = local_60.lo_;
    local_28.hi_ = local_60.hi_;
    local_30 = 0x13;
  }
  std::__cxx11::ostringstream::ostringstream(local_1d8);
  _Var2 = std::operator|(_S_basefield,_S_showbase);
  local_1dc = std::operator|(_Var2,_S_uppercase);
  std::operator&(local_14,local_1dc);
  std::ios_base::setf((ios_base *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                      (fmtflags)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
                      (fmtflags)in_stack_fffffffffffffcc8);
  local_208 = (uint128 *)*local_10;
  puStack_200 = (uint128 *)local_10[1];
  uint128::uint128(&local_218);
  dividend.hi_ = local_28.hi_;
  dividend.lo_ = local_28.lo_;
  divisor.hi_ = in_stack_fffffffffffffdc0;
  divisor.lo_ = in_stack_fffffffffffffdb8;
  uVar7 = local_28.lo_;
  uVar8 = local_28.hi_;
  uint128::DivModImpl(dividend,divisor,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  uint128::uint128((uint128 *)&stack0xfffffffffffffdb8);
  local_268 = local_28.lo_;
  uStack_260 = local_28.hi_;
  dividend_00.hi_ = uVar8;
  dividend_00.lo_ = uVar7;
  divisor_00.hi_ = in_stack_fffffffffffffdc0;
  divisor_00.lo_ = in_stack_fffffffffffffdb8;
  uint128::DivModImpl(dividend_00,divisor_00,puStack_200,local_208);
  if (local_208 == (uint128 *)0x0) {
    if (in_stack_fffffffffffffdb8 != 0) {
      std::ostream::operator<<(local_1d8,in_stack_fffffffffffffdb8);
      uVar3 = std::ostream::operator<<(local_1d8,std::noshowbase);
      local_275 = (char)std::setfill<char>('0');
      poVar4 = std::operator<<(uVar3,local_275);
      local_27c = (int)std::setw((int)local_30);
      std::operator<<(poVar4,(_Setw)local_27c);
    }
  }
  else {
    std::ostream::operator<<(local_1d8,(ulong)local_208);
    uVar3 = std::ostream::operator<<(local_1d8,std::noshowbase);
    local_269 = (char)std::setfill<char>('0');
    poVar4 = std::operator<<(uVar3,local_269);
    local_270 = (int)std::setw((int)local_30);
    std::operator<<(poVar4,(_Setw)local_270);
    std::ostream::operator<<(local_1d8,in_stack_fffffffffffffdb8);
    local_274 = (int)std::setw((int)local_30);
    std::operator<<((ostream *)local_1d8,(_Setw)local_274);
  }
  std::ostream::operator<<(local_1d8,local_218.lo_);
  std::__cxx11::ostringstream::str();
  uVar5 = std::ios_base::width((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)),0);
  uVar6 = std::__cxx11::string::size();
  if (uVar6 < uVar5) {
    _Var2 = std::operator&(local_14,_S_adjustfield);
    if (_Var2 == _S_left) {
      cVar1 = std::__cxx11::string::size();
      std::ios::fill();
      std::__cxx11::string::append((ulong)local_2a0,(char)uVar5 - cVar1);
    }
    else {
      cVar1 = std::__cxx11::string::size();
      cVar1 = (char)uVar5 - cVar1;
      std::ios::fill();
      std::__cxx11::string::insert((ulong)local_2a0,0,cVar1);
    }
  }
  poVar4 = std::operator<<(local_8,local_2a0);
  std::__cxx11::string::~string(local_2a0);
  std::__cxx11::ostringstream::~ostringstream(local_1d8);
  return poVar4;
}

Assistant:

std::ostream& operator<<(std::ostream& o, const uint128& b) {
  std::ios_base::fmtflags flags = o.flags();

  // Select a divisor which is the largest power of the base < 2^64.
  uint128 div;
  std::streamsize div_base_log;
  switch (flags & std::ios::basefield) {
    case std::ios::hex:
      div =
          static_cast<uint64>(PROTOBUF_ULONGLONG(0x1000000000000000));  // 16^15
      div_base_log = 15;
      break;
    case std::ios::oct:
      div = static_cast<uint64>(
          PROTOBUF_ULONGLONG(01000000000000000000000));  // 8^21
      div_base_log = 21;
      break;
    default:  // std::ios::dec
      div = static_cast<uint64>(
          PROTOBUF_ULONGLONG(10000000000000000000));  // 10^19
      div_base_log = 19;
      break;
  }

  // Now piece together the uint128 representation from three chunks of
  // the original value, each less than "div" and therefore representable
  // as a uint64.
  std::ostringstream os;
  std::ios_base::fmtflags copy_mask =
      std::ios::basefield | std::ios::showbase | std::ios::uppercase;
  os.setf(flags & copy_mask, copy_mask);
  uint128 high = b;
  uint128 low;
  uint128::DivModImpl(high, div, &high, &low);
  uint128 mid;
  uint128::DivModImpl(high, div, &high, &mid);
  if (high.lo_ != 0) {
    os << high.lo_;
    os << std::noshowbase << std::setfill('0') << std::setw(div_base_log);
    os << mid.lo_;
    os << std::setw(div_base_log);
  } else if (mid.lo_ != 0) {
    os << mid.lo_;
    os << std::noshowbase << std::setfill('0') << std::setw(div_base_log);
  }
  os << low.lo_;
  std::string rep = os.str();

  // Add the requisite padding.
  std::streamsize width = o.width(0);
  if (width > rep.size()) {
    if ((flags & std::ios::adjustfield) == std::ios::left) {
      rep.append(width - rep.size(), o.fill());
    } else {
      rep.insert(static_cast<std::string::size_type>(0),
                 width - rep.size(), o.fill());
    }
  }

  // Stream the final representation in a single "<<" call.
  return o << rep;
}